

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::LossParameter::Clear(LossParameter *this)

{
  LossParameter *this_local;
  
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    memset(&this->ignore_label_,0,5);
    this->normalization_ = 1;
  }
  memset(&this->_has_bits_,0,4);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  }
  return;
}

Assistant:

void LossParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.LossParameter)
  if (_has_bits_[0 / 32] & 7u) {
    ::memset(&ignore_label_, 0, reinterpret_cast<char*>(&normalize_) -
      reinterpret_cast<char*>(&ignore_label_) + sizeof(normalize_));
    normalization_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}